

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O1

void duckdb::MapFunction(DataChunk *args,ExpressionState *param_2,Vector *result)

{
  ulong *puVar1;
  UnifiedVectorFormat *pUVar2;
  long lVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  byte bVar5;
  undefined8 uVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  undefined1 auVar8 [8];
  char cVar9;
  reference pvVar10;
  reference pvVar11;
  Vector *pVVar12;
  UnifiedVectorFormat *pUVar13;
  list_entry_t *plVar14;
  UnifiedVectorFormat *pUVar15;
  TemplatedValidityData<unsigned_long> *pTVar16;
  Vector *pVVar17;
  UnifiedVectorFormat *pUVar18;
  ulong uVar19;
  idx_t count;
  ulong uVar20;
  VectorType VVar21;
  ulong uVar22;
  ulong uVar23;
  idx_t idx_in_entry;
  long lVar24;
  pair<std::__detail::_Node_iterator<duckdb::Value,_true,_true>,_bool> pVar25;
  SelectionVector sel_values;
  SelectionVector sel_keys;
  value_set_t unique_keys;
  UnifiedVectorFormat values_data;
  Value value;
  UnifiedVectorFormat keys_data;
  Vector keys_child_vector;
  UnifiedVectorFormat result_data;
  UnifiedVectorFormat keys_child_data;
  Vector values_child_vector;
  UnifiedVectorFormat values_child_data;
  ulong local_388;
  UnifiedVectorFormat *local_380;
  ulong local_378;
  _Hashtable<duckdb::Value,_duckdb::Value,_std::allocator<duckdb::Value>,_std::__detail::_Identity,_duckdb::ValueEquality,_duckdb::ValueHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  *local_320;
  SelectionVector local_318;
  SelectionVector local_300;
  _Hashtable<duckdb::Value,_duckdb::Value,_std::allocator<duckdb::Value>,_std::__detail::_Identity,_duckdb::ValueEquality,_duckdb::ValueHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_2e8;
  long *local_2b0;
  long local_2a8;
  long local_2a0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_290;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_270;
  undefined8 local_268;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_260;
  long *local_220;
  long local_218;
  long local_210;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_200;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1e0;
  undefined1 local_1d8 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_1d0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1a0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_188;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_178;
  long *local_170;
  long local_168;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_150;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_130;
  long *local_128 [2];
  long local_118;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_108;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_e8;
  undefined1 local_e0 [56];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_90;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_80;
  long *local_78 [4];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  VVar21 = (VectorType)result;
  if (*(long *)args != *(long *)(args + 8)) {
    pvVar10 = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)args,0);
    pvVar11 = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)args,1);
    if ((pvVar10[8] == (value_type)0x1) || (pvVar11[8] == (value_type)0x1)) {
      FlatVector::VerifyFlatVector(result);
      if (*(long *)(result + 0x28) == 0) {
        local_e0._0_8_ = *(undefined8 *)(result + 0x40);
        make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                  ((duckdb *)local_1d8,(unsigned_long *)local_e0);
        p_Var7 = p_Stack_1d0;
        auVar8 = local_1d8;
        local_1d8 = (undefined1  [8])0x0;
        p_Stack_1d0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        p_Var4 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x38);
        *(undefined1 (*) [8])(result + 0x30) = auVar8;
        *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x38) = p_Var7;
        if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
        }
        if (p_Stack_1d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_1d0);
        }
        pTVar16 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                            ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                             (result + 0x30));
        *(unsigned_long **)(result + 0x28) =
             (pTVar16->owned_data).
             super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
             super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
             super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
      }
      **(ulong **)(result + 0x28) = **(ulong **)(result + 0x28) & 0xfffffffffffffffe;
      duckdb::Vector::SetVectorType(VVar21);
      return;
    }
  }
  pUVar2 = *(UnifiedVectorFormat **)(args + 0x18);
  if (*(long *)args != *(long *)(args + 8)) {
    pvVar10 = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)args,0);
    pvVar11 = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)args,1);
    duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_220);
    duckdb::Vector::ToUnifiedFormat((ulong)pvVar10,pUVar2);
    pVVar12 = (Vector *)duckdb::ListVector::GetEntry(pvVar10);
    duckdb::Vector::Vector((Vector *)local_1d8,pVVar12);
    duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_128);
    pUVar13 = (UnifiedVectorFormat *)duckdb::ListVector::GetListSize(pvVar10);
    duckdb::Vector::ToUnifiedFormat((ulong)local_1d8,pUVar13);
    duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_2b0);
    duckdb::Vector::ToUnifiedFormat((ulong)pvVar11,pUVar2);
    pVVar12 = (Vector *)duckdb::ListVector::GetEntry(pvVar11);
    duckdb::Vector::Vector((Vector *)local_e0,pVVar12);
    duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_78);
    pUVar13 = (UnifiedVectorFormat *)duckdb::ListVector::GetListSize(pvVar11);
    duckdb::Vector::ToUnifiedFormat((ulong)local_e0,pUVar13);
    duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_170);
    duckdb::Vector::ToUnifiedFormat((ulong)result,pUVar2);
    FlatVector::VerifyFlatVector(result);
    if (pUVar2 == (UnifiedVectorFormat *)0x0) {
      count = 0;
    }
    else {
      count = 0;
      pUVar13 = (UnifiedVectorFormat *)0x0;
      do {
        pUVar15 = pUVar13;
        if (*local_220 != 0) {
          pUVar15 = (UnifiedVectorFormat *)(ulong)*(uint *)(*local_220 + (long)pUVar13 * 4);
        }
        pUVar18 = pUVar13;
        if (*local_2b0 != 0) {
          pUVar18 = (UnifiedVectorFormat *)(ulong)*(uint *)(*local_2b0 + (long)pUVar13 * 4);
        }
        if (((local_210 == 0) ||
            ((*(ulong *)(local_210 + ((ulong)pUVar15 >> 6) * 8) >> ((ulong)pUVar15 & 0x3f) & 1) != 0
            )) && ((local_2a0 == 0 ||
                   ((*(ulong *)(local_2a0 + ((ulong)pUVar18 >> 6) * 8) >> ((ulong)pUVar18 & 0x3f) &
                    1) != 0)))) {
          count = count + *(long *)(local_218 + 8 + (long)pUVar15 * 0x10);
        }
        pUVar13 = pUVar13 + 1;
      } while (pUVar2 != pUVar13);
    }
    SelectionVector::SelectionVector(&local_300,count);
    SelectionVector::SelectionVector(&local_318,count);
    if (pUVar2 == (UnifiedVectorFormat *)0x0) {
      local_388 = 0;
    }
    else {
      local_388 = 0;
      pUVar13 = (UnifiedVectorFormat *)0x0;
      do {
        pUVar15 = pUVar13;
        if (*local_220 != 0) {
          pUVar15 = (UnifiedVectorFormat *)(ulong)*(uint *)(*local_220 + (long)pUVar13 * 4);
        }
        pUVar18 = pUVar13;
        if (*local_2b0 != 0) {
          pUVar18 = (UnifiedVectorFormat *)(ulong)*(uint *)(*local_2b0 + (long)pUVar13 * 4);
        }
        local_380 = pUVar13;
        if (*local_170 != 0) {
          local_380 = (UnifiedVectorFormat *)(ulong)*(uint *)(*local_170 + (long)pUVar13 * 4);
        }
        if (((local_210 == 0) ||
            ((*(ulong *)(local_210 + ((ulong)pUVar15 >> 6) * 8) >> ((ulong)pUVar15 & 0x3f) & 1) != 0
            )) && ((local_2a0 == 0 ||
                   ((*(ulong *)(local_2a0 + ((ulong)pUVar18 >> 6) * 8) >> ((ulong)pUVar18 & 0x3f) &
                    1) != 0)))) {
          uVar22 = *(ulong *)(local_218 + (long)pUVar15 * 0x10);
          lVar3 = *(long *)(local_218 + 8 + (long)pUVar15 * 0x10);
          uVar19 = *(ulong *)(local_2a8 + (long)pUVar18 * 0x10);
          if (lVar3 != *(long *)(local_2a8 + 8 + (long)pUVar18 * 0x10)) {
            duckdb::MapVector::EvalMapInvalidReason(NOT_ALIGNED);
          }
          local_2e8._M_buckets = &local_2e8._M_single_bucket;
          local_2e8._M_bucket_count = 1;
          local_2e8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
          local_2e8._M_element_count = 0;
          local_2e8._M_rehash_policy._M_max_load_factor = 1.0;
          local_2e8._M_rehash_policy._M_next_resize = 0;
          local_2e8._M_single_bucket = (__node_base_ptr)0x0;
          uVar20 = local_388;
          for (lVar24 = lVar3; lVar24 != 0; lVar24 = lVar24 + -1) {
            uVar23 = uVar22;
            if (*local_128[0] != 0) {
              uVar23 = (ulong)*(uint *)(*local_128[0] + uVar22 * 4);
            }
            local_378 = uVar19;
            if (*local_78[0] != 0) {
              local_378 = (ulong)*(uint *)(*local_78[0] + uVar19 * 4);
            }
            if ((local_118 != 0) &&
               ((*(ulong *)(local_118 + (uVar23 >> 6) * 8) >> (uVar23 & 0x3f) & 1) == 0)) {
              duckdb::MapVector::EvalMapInvalidReason(NULL_KEY);
            }
            duckdb::Vector::GetValue((ulong)&local_268);
            local_320 = &local_2e8;
            pVar25 = std::
                     _Hashtable<duckdb::Value,duckdb::Value,std::allocator<duckdb::Value>,std::__detail::_Identity,duckdb::ValueEquality,duckdb::ValueHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                     ::
                     _M_insert<duckdb::Value_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::Value,true>>>>
                               ((_Hashtable<duckdb::Value,duckdb::Value,std::allocator<duckdb::Value>,std::__detail::_Identity,duckdb::ValueEquality,duckdb::ValueHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                                 *)local_320,&local_268,&local_320);
            if (((undefined1  [16])pVar25 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
              duckdb::MapVector::EvalMapInvalidReason(DUPLICATE_KEY);
            }
            local_300.sel_vector[uVar20] = (sel_t)uVar23;
            local_318.sel_vector[uVar20] = (sel_t)local_378;
            duckdb::Value::~Value((Value *)&local_268);
            uVar20 = uVar20 + 1;
            uVar19 = uVar19 + 1;
            uVar22 = uVar22 + 1;
          }
          *(long *)(local_168 + 8 + (long)local_380 * 0x10) = lVar3;
          *(ulong *)(local_168 + (long)local_380 * 0x10) = local_388;
          local_388 = local_388 + lVar3;
          std::
          _Hashtable<duckdb::Value,_duckdb::Value,_std::allocator<duckdb::Value>,_std::__detail::_Identity,_duckdb::ValueEquality,_duckdb::ValueHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::~_Hashtable(&local_2e8);
        }
        else {
          if (*(long *)(result + 0x28) == 0) {
            local_2e8._M_buckets = *(__buckets_ptr *)(result + 0x40);
            make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                      ((duckdb *)&local_268,(unsigned_long *)&local_2e8);
            p_Var7 = p_Stack_260;
            uVar6 = local_268;
            local_268 = 0;
            p_Stack_260 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            p_Var4 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x38);
            *(undefined8 *)(result + 0x30) = uVar6;
            *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x38) = p_Var7;
            if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
            }
            if (p_Stack_260 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_260);
            }
            pTVar16 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                                 (result + 0x30));
            *(unsigned_long **)(result + 0x28) =
                 (pTVar16->owned_data).
                 super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                 super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                 super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
          }
          bVar5 = (byte)pUVar13 & 0x3f;
          puVar1 = (ulong *)(*(long *)(result + 0x28) + ((ulong)pUVar13 >> 6) * 8);
          *puVar1 = *puVar1 & (-2L << bVar5 | 0xfffffffffffffffeU >> 0x40 - bVar5);
        }
        pUVar13 = pUVar13 + 1;
      } while (pUVar13 != pUVar2);
    }
    pVVar12 = (Vector *)duckdb::MapVector::GetKeys(result);
    pVVar17 = (Vector *)duckdb::MapVector::GetValues(result);
    duckdb::ListVector::SetListSize(result,local_388);
    duckdb::Vector::Slice(pVVar12,(SelectionVector *)local_1d8,(ulong)&local_300);
    duckdb::Vector::Flatten((ulong)pVVar12);
    duckdb::Vector::Slice(pVVar17,(SelectionVector *)local_e0,(ulong)&local_318);
    duckdb::Vector::Flatten((ulong)pVVar17);
    pVVar12 = (Vector *)duckdb::ListVector::GetEntry(result);
    FlatVector::VerifyFlatVector(pVVar12);
    duckdb::ValidityMask::Resize((ulong)(pVVar12 + 0x28));
    cVar9 = duckdb::DataChunk::AllConstant();
    if (cVar9 != '\0') {
      duckdb::Vector::SetVectorType(VVar21);
    }
    duckdb::Vector::Verify((ulong)result);
    if (local_318.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_318.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_300.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_300.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_130 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_130);
    }
    if (local_150 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_150);
    }
    if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
    }
    if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
    }
    if (local_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_80);
    }
    if (local_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_90);
    }
    if (local_a8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a8);
    }
    duckdb::LogicalType::~LogicalType((LogicalType *)(local_e0 + 8));
    if (local_270 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_270);
    }
    if (local_290 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_290);
    }
    if (local_e8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e8);
    }
    if (local_108 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_108);
    }
    if (local_178 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_178);
    }
    if (local_188 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_188);
    }
    if (local_1a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1a0);
    }
    duckdb::LogicalType::~LogicalType((LogicalType *)&p_Stack_1d0);
    if (local_1e0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1e0);
    }
    if (local_200 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_200);
    }
    return;
  }
  duckdb::Vector::SetVectorType(VVar21);
  duckdb::ListVector::SetListSize(result,0);
  plVar14 = ListVector::GetData(result);
  plVar14->offset = 0;
  plVar14->length = 0;
  duckdb::Vector::Verify((ulong)result);
  return;
}

Assistant:

static void MapFunction(DataChunk &args, ExpressionState &, Vector &result) {

	// internal MAP representation
	// - LIST-vector that contains STRUCTs as child entries
	// - STRUCTs have exactly two fields, a key-field, and a value-field
	// - key names are unique
	D_ASSERT(result.GetType().id() == LogicalTypeId::MAP);

	if (MapIsNull(args)) {
		auto &validity = FlatVector::Validity(result);
		validity.SetInvalid(0);
		result.SetVectorType(VectorType::CONSTANT_VECTOR);
		return;
	}

	auto row_count = args.size();

	// early-out, if no data
	if (args.data.empty()) {
		return MapFunctionEmptyInput(result, row_count);
	}

	auto &keys = args.data[0];
	auto &values = args.data[1];

	// a LIST vector, where each row contains a LIST of KEYS
	UnifiedVectorFormat keys_data;
	keys.ToUnifiedFormat(row_count, keys_data);
	auto keys_entries = UnifiedVectorFormat::GetData<list_entry_t>(keys_data);

	// the KEYs child vector
	auto keys_child_vector = ListVector::GetEntry(keys);
	UnifiedVectorFormat keys_child_data;
	keys_child_vector.ToUnifiedFormat(ListVector::GetListSize(keys), keys_child_data);

	// a LIST vector, where each row contains a LIST of VALUES
	UnifiedVectorFormat values_data;
	values.ToUnifiedFormat(row_count, values_data);
	auto values_entries = UnifiedVectorFormat::GetData<list_entry_t>(values_data);

	// the VALUEs child vector
	auto values_child_vector = ListVector::GetEntry(values);
	UnifiedVectorFormat values_child_data;
	values_child_vector.ToUnifiedFormat(ListVector::GetListSize(values), values_child_data);

	// a LIST vector, where each row contains a MAP (LIST of STRUCTs)
	UnifiedVectorFormat result_data;
	result.ToUnifiedFormat(row_count, result_data);
	auto result_entries = UnifiedVectorFormat::GetDataNoConst<list_entry_t>(result_data);

	auto &result_validity = FlatVector::Validity(result);

	// get the resulting size of the key/value child lists
	idx_t result_child_size = 0;
	for (idx_t row_idx = 0; row_idx < row_count; row_idx++) {
		auto keys_idx = keys_data.sel->get_index(row_idx);
		auto values_idx = values_data.sel->get_index(row_idx);
		if (!keys_data.validity.RowIsValid(keys_idx) || !values_data.validity.RowIsValid(values_idx)) {
			continue;
		}
		auto keys_entry = keys_entries[keys_idx];
		result_child_size += keys_entry.length;
	}

	// we need to slice potential non-flat vectors
	SelectionVector sel_keys(result_child_size);
	SelectionVector sel_values(result_child_size);
	idx_t offset = 0;

	for (idx_t row_idx = 0; row_idx < row_count; row_idx++) {

		auto keys_idx = keys_data.sel->get_index(row_idx);
		auto values_idx = values_data.sel->get_index(row_idx);
		auto result_idx = result_data.sel->get_index(row_idx);

		// NULL MAP
		if (!keys_data.validity.RowIsValid(keys_idx) || !values_data.validity.RowIsValid(values_idx)) {
			result_validity.SetInvalid(row_idx);
			continue;
		}

		auto keys_entry = keys_entries[keys_idx];
		auto values_entry = values_entries[values_idx];

		if (keys_entry.length != values_entry.length) {
			MapVector::EvalMapInvalidReason(MapInvalidReason::NOT_ALIGNED);
		}

		// set the selection vectors and perform a duplicate key check
		value_set_t unique_keys;
		for (idx_t child_idx = 0; child_idx < keys_entry.length; child_idx++) {

			auto key_idx = keys_child_data.sel->get_index(keys_entry.offset + child_idx);
			auto value_idx = values_child_data.sel->get_index(values_entry.offset + child_idx);

			// NULL check
			if (!keys_child_data.validity.RowIsValid(key_idx)) {
				MapVector::EvalMapInvalidReason(MapInvalidReason::NULL_KEY);
			}

			// unique check
			auto value = keys_child_vector.GetValue(key_idx);
			auto unique = unique_keys.insert(value).second;
			if (!unique) {
				MapVector::EvalMapInvalidReason(MapInvalidReason::DUPLICATE_KEY);
			}

			// set selection vectors
			sel_keys.set_index(offset + child_idx, key_idx);
			sel_values.set_index(offset + child_idx, value_idx);
		}

		// keys_entry and values_entry have the same length
		result_entries[result_idx].length = keys_entry.length;
		result_entries[result_idx].offset = offset;
		offset += keys_entry.length;
	}
	D_ASSERT(offset == result_child_size);

	auto &result_key_vector = MapVector::GetKeys(result);
	auto &result_value_vector = MapVector::GetValues(result);

	ListVector::SetListSize(result, offset);
	result_key_vector.Slice(keys_child_vector, sel_keys, offset);
	result_key_vector.Flatten(offset);
	result_value_vector.Slice(values_child_vector, sel_values, offset);
	result_value_vector.Flatten(offset);
	FlatVector::Validity(ListVector::GetEntry(result)).Resize(result_child_size);

	if (args.AllConstant()) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);
	}
	result.Verify(row_count);
}